

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O1

rt_function_error_t exec_matrix_diag(rt_function_t *f)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined4 uVar9;
  
  plVar2 = (long *)f->local_context;
  lVar4 = plVar2[2];
  if (0 < (long)(int)lVar4) {
    lVar3 = *(long *)(*plVar2 + 0x18);
    lVar7 = *(long *)(plVar2[3] + 0x18);
    uVar1 = *(uint *)((long)plVar2 + 0x2c);
    uVar8 = (ulong)uVar1;
    uVar6 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          uVar9 = 0;
          if ((uVar6 & 0xffffffff) % uVar8 == uVar5) {
            uVar9 = *(undefined4 *)(lVar3 + uVar6 * 4);
          }
          *(undefined4 *)(lVar7 + uVar5 * 4) = uVar9;
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + uVar8 * 4;
    } while (uVar6 != (long)(int)lVar4);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);
  float *x = (float *)(context->input->data);
  float *y = (float *)(context->output->data);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        y[i * context->last_ndim + j] = x[i];
      } else {
        y[i * context->last_ndim + j] = 0.;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}